

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

Encoding ON_String::ProbableEncoding(char *buffer,int buffer_length)

{
  bool bVar1;
  Encoding EVar2;
  
  EVar2 = Unknown;
  if (buffer != (char *)0x0) {
    if (buffer_length == -1) {
      buffer_length = Length(buffer);
    }
    if (0 < buffer_length) {
      EVar2 = ASCII;
      bVar1 = IsPossibleEncoding(ASCII,buffer,buffer_length);
      if (!bVar1) {
        EVar2 = UTF8;
        bVar1 = IsPossibleEncoding(UTF8,buffer,buffer_length);
        if (!bVar1) {
          EVar2 = BIG5andASCII;
          bVar1 = IsPossibleEncoding(BIG5andASCII,buffer,buffer_length);
          if (!bVar1) {
            bVar1 = IsPossibleEncoding(SloppyUTF8,buffer,buffer_length);
            EVar2 = (uint)bVar1 + (uint)bVar1 * 2 + Unknown;
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ON_String::Encoding ON_String::ProbableEncoding(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::Encoding::Unknown;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);

  if (buffer_length <= 0)
    return ON_String::Encoding::Unknown;

  if (ON_String::IsPossibleEncoding(ON_String::Encoding::ASCII, buffer, buffer_length))
    return ON_String::Encoding::ASCII;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::UTF8, buffer, buffer_length))
    return ON_String::Encoding::UTF8;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::BIG5andASCII, buffer, buffer_length))
    return ON_String::Encoding::BIG5andASCII;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::SloppyUTF8, buffer, buffer_length))
    return ON_String::Encoding::SloppyUTF8;

  return ON_String::Encoding::Unknown;
}